

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O1

bool duckdb::alp::AlpCompression<double,_true>::CompareALPCombinations
               (AlpCombination *c1,AlpCombination *c2)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = c1->n_appearances;
  uVar2 = c2->n_appearances;
  bVar4 = uVar1 == uVar2;
  if (uVar2 <= uVar1 && !bVar4) {
    return true;
  }
  if (bVar4) {
    bVar3 = c1->estimated_compression_size < c2->estimated_compression_size;
    if (!bVar4 || bVar3) {
      return bVar3;
    }
    if (c1->estimated_compression_size == c2->estimated_compression_size) {
      bVar4 = (c2->encoding_indices).exponent < (c1->encoding_indices).exponent;
      if (uVar1 != uVar2 || bVar4) {
        return bVar4;
      }
    }
    else if (uVar1 != uVar2) {
      return false;
    }
    if ((c1->estimated_compression_size == c2->estimated_compression_size) &&
       ((c2->encoding_indices).exponent == (c1->encoding_indices).exponent)) {
      return (c2->encoding_indices).factor < (c1->encoding_indices).factor;
    }
  }
  return false;
}

Assistant:

static bool CompareALPCombinations(const AlpCombination &c1, const AlpCombination &c2) {
		return (c1.n_appearances > c2.n_appearances) ||
		       (c1.n_appearances == c2.n_appearances &&
		        (c1.estimated_compression_size < c2.estimated_compression_size)) ||
		       ((c1.n_appearances == c2.n_appearances &&
		         c1.estimated_compression_size == c2.estimated_compression_size) &&
		        (c2.encoding_indices.exponent < c1.encoding_indices.exponent)) ||
		       ((c1.n_appearances == c2.n_appearances &&
		         c1.estimated_compression_size == c2.estimated_compression_size &&
		         c2.encoding_indices.exponent == c1.encoding_indices.exponent) &&
		        (c2.encoding_indices.factor < c1.encoding_indices.factor));
	}